

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::Invalidate(GLContextState *this)

{
  pointer pBVar1;
  pointer piVar2;
  pointer pBVar3;
  pointer pBVar4;
  Uint32 rt;
  long lVar5;
  GLenum err;
  string msg;
  
  if (this->m_PendingMemoryBarriers != MEMORY_BARRIER_NONE) {
    EnsureMemoryBarrier(this,this->m_PendingMemoryBarriers,(AsyncWritableResource *)0x0);
  }
  this->m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (*__glewUseProgram)(0);
  if ((this->m_Caps).IsProgramPipelineSupported == true) {
    (*__glewBindProgramPipeline)(0);
  }
  (*__glewBindVertexArray)(0);
  (*__glewBindFramebuffer)(0x8ca9,0);
  (*__glewBindFramebuffer)(0x8ca8,0);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[33],char[17],unsigned_int>
              (false,"Invalidate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,99,(char (*) [33])"Failed to reset GL context state",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Invalidate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,99);
    std::__cxx11::string::~string((string *)&msg);
  }
  this->m_GLProgId = -1;
  this->m_GLPipelineId = -1;
  this->m_VAOId = -1;
  this->m_FBOId = -1;
  pBVar1 = (this->m_BoundTextures).
           super__Vector_base<Diligent::GLContextState::BoundTextureInfo,_std::allocator<Diligent::GLContextState::BoundTextureInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_BoundTextures).
      super__Vector_base<Diligent::GLContextState::BoundTextureInfo,_std::allocator<Diligent::GLContextState::BoundTextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar1) {
    (this->m_BoundTextures).
    super__Vector_base<Diligent::GLContextState::BoundTextureInfo,_std::allocator<Diligent::GLContextState::BoundTextureInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  piVar2 = (this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->m_BoundSamplers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  pBVar3 = (this->m_BoundImages).
           super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_BoundImages).
      super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar3) {
    (this->m_BoundImages).
    super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar3;
  }
  pBVar4 = (this->m_BoundUniformBuffers).
           super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_BoundUniformBuffers).
      super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar4) {
    (this->m_BoundUniformBuffers).
    super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar4;
  }
  pBVar4 = (this->m_BoundStorageBlocks).
           super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_BoundStorageBlocks).
      super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar4) {
    (this->m_BoundStorageBlocks).
    super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar4;
  }
  msg.field_2._M_allocated_capacity = 0;
  msg.field_2._8_4_ = 0;
  msg.field_2._12_4_ = 0;
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = 0;
  DepthStencilGLState::DepthStencilGLState((DepthStencilGLState *)&msg);
  *(ulong *)&(this->m_DSState).m_StencilOpState[0].Mask = (ulong)(uint)msg.field_2._12_4_;
  (this->m_DSState).m_StencilOpState[1].Ref = 0;
  (this->m_DSState).m_StencilOpState[1].Mask = 0;
  (this->m_DSState).m_StencilReadMask = msg.field_2._M_allocated_capacity._0_2_;
  (this->m_DSState).m_StencilWriteMask = msg.field_2._2_2_;
  (this->m_DSState).m_StencilOpState[0].Func = msg.field_2._4_1_;
  (this->m_DSState).m_StencilOpState[0].StencilFailOp = msg.field_2._5_1_;
  (this->m_DSState).m_StencilOpState[0].StencilDepthFailOp = msg.field_2._6_1_;
  (this->m_DSState).m_StencilOpState[0].StencilPassOp = msg.field_2._7_1_;
  (this->m_DSState).m_StencilOpState[0].Ref = msg.field_2._8_4_;
  (this->m_DSState).m_StencilOpState[0].Mask = msg.field_2._12_4_;
  *(pointer *)&this->m_DSState = msg._M_dataplus._M_p;
  (this->m_DSState).m_DepthCmpFunc = (undefined1)msg._M_string_length;
  *(undefined3 *)&(this->m_DSState).field_0x9 = msg._M_string_length._1_3_;
  (this->m_DSState).m_StencilTestEnableState = (EnableStateHelper)msg._M_string_length._4_4_;
  (this->m_RSState).FillMode = FILL_MODE_UNDEFINED;
  (this->m_RSState).CullMode = CULL_MODE_UNDEFINED;
  *(undefined2 *)&(this->m_RSState).field_0x2 = 0;
  (this->m_RSState).FrontCounterClockwise = UNKNOWN;
  (this->m_RSState).fDepthBias = 3.4028235e+38;
  (this->m_RSState).fSlopeScaledDepthBias = 3.4028235e+38;
  (this->m_RSState).DepthClampEnable = UNKNOWN;
  (this->m_RSState).ScissorTestEnable = UNKNOWN;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    this->m_ColorWriteMasks[lVar5] = 0xff;
  }
  this->m_bIndexedWriteMasks = UNKNOWN;
  this->m_iActiveTexture = -1;
  this->m_NumPatchVertices = -1;
  return;
}

Assistant:

void GLContextState::Invalidate()
{
#if !PLATFORM_ANDROID
    // On Android this results in OpenGL error, so we will not
    // clear the barriers. All the required barriers will be
    // executed next frame when needed
    if (m_PendingMemoryBarriers != 0)
        EnsureMemoryBarrier(m_PendingMemoryBarriers);
    m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
#endif

    // Unity messes up at least VAO left in the context,
    // so unbid what we bound
    glUseProgram(0);
    if (m_Caps.IsProgramPipelineSupported)
        glBindProgramPipeline(0);

    glBindVertexArray(0);
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
    DEV_CHECK_GL_ERROR("Failed to reset GL context state");

    m_GLProgId     = -1;
    m_GLPipelineId = -1;
    m_VAOId        = -1;
    m_FBOId        = -1;

    m_BoundTextures.clear();
    m_BoundSamplers.clear();
    m_BoundImages.clear();
    m_BoundUniformBuffers.clear();
    m_BoundStorageBlocks.clear();

    m_DSState = DepthStencilGLState();
    m_RSState = RasterizerGLState();

    for (Uint32 rt = 0; rt < _countof(m_ColorWriteMasks); ++rt)
        m_ColorWriteMasks[rt] = 0xFF;

    m_bIndexedWriteMasks = EnableStateHelper();

    m_iActiveTexture   = -1;
    m_NumPatchVertices = -1;
}